

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O0

parser_error parse_eff_lash_type(parser *p)

{
  void *pvVar1;
  char *name;
  wchar_t local_20;
  wchar_t type;
  blow_effect *eff;
  parser *p_local;
  
  pvVar1 = parser_priv(p);
  if (pvVar1 == (void *)0x0) {
    __assert_fail("eff",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-init.c"
                  ,0x18d,"enum parser_error parse_eff_lash_type(struct parser *)");
  }
  name = parser_getstr(p,"type");
  local_20 = proj_name_to_idx(name);
  if (local_20 < L'\0') {
    local_20 = L'\x18';
  }
  *(wchar_t *)((long)pvVar1 + 0x2c) = local_20;
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_eff_lash_type(struct parser *p) {
	struct blow_effect *eff = parser_priv(p);
	int type;
	assert(eff);

	type = proj_name_to_idx(parser_getstr(p, "type"));
	eff->lash_type = type >= 0 ? type : PROJ_MISSILE;
	return PARSE_ERROR_NONE;
}